

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_168b90f::LowBDConvolveHorizRSTest::RunOne
          (LowBDConvolveHorizRSTest *this,bool ref)

{
  int iVar1;
  int iVar2;
  int in_length;
  int out_length;
  int h;
  int iVar3;
  int32_t iVar4;
  uchar *src_00;
  uchar *puVar5;
  int unaff_EBX;
  byte in_SIL;
  int16_t *in_RDI;
  int unaff_retaddr;
  int32_t x_step_qn;
  int x0_qn;
  int height;
  int width_dst;
  int width_src;
  int dst_stride;
  int src_stride;
  uint8_t *dst;
  uint8_t *src;
  undefined4 in_stack_ffffffffffffffbc;
  undefined2 uVar6;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int16_t *x_filters;
  
  uVar6 = (undefined2)((uint)in_stack_ffffffffffffffbc >> 0x10);
  x_filters = in_RDI;
  src_00 = TestImage<unsigned_char>::GetSrcData
                     ((TestImage<unsigned_char> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      SUB41((uint)in_stack_ffffffffffffffbc >> 0x18,0),
                      SUB41((uint)in_stack_ffffffffffffffbc >> 0x10,0));
  puVar5 = TestImage<unsigned_char>::GetDstData
                     ((TestImage<unsigned_char> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      SUB21((ushort)uVar6 >> 8,0),SUB21(uVar6,0));
  iVar1 = TestImage<unsigned_char>::src_stride(*(TestImage<unsigned_char> **)(in_RDI + 0xc));
  iVar2 = TestImage<unsigned_char>::dst_stride(*(TestImage<unsigned_char> **)(in_RDI + 0xc));
  in_length = TestImage<unsigned_char>::src_width(*(TestImage<unsigned_char> **)(in_RDI + 0xc));
  out_length = TestImage<unsigned_char>::dst_width(*(TestImage<unsigned_char> **)(in_RDI + 0xc));
  h = TestImage<unsigned_char>::height(*(TestImage<unsigned_char> **)(in_RDI + 0xc));
  iVar3 = TestImage<unsigned_char>::x0(*(TestImage<unsigned_char> **)(in_RDI + 0xc));
  iVar4 = av1_get_upscale_convolve_step(in_length,out_length);
  if ((in_SIL & 1) == 0) {
    (**(code **)(in_RDI + 0x14))
              (src_00,iVar1,puVar5,iVar2,out_length,h,av1_resize_filter_normative,iVar3,iVar4);
  }
  else {
    av1_convolve_horiz_rs_c
              (src_00,(int)((ulong)puVar5 >> 0x20),(uint8_t *)CONCAT44(iVar1,iVar2),in_length,
               out_length,h,x_filters,unaff_EBX,unaff_retaddr);
  }
  return;
}

Assistant:

void RunOne(bool ref) override {
    const uint8_t *src = image_->GetSrcData(ref, false);
    uint8_t *dst = image_->GetDstData(ref, false);
    const int src_stride = image_->src_stride();
    const int dst_stride = image_->dst_stride();
    const int width_src = image_->src_width();
    const int width_dst = image_->dst_width();
    const int height = image_->height();
    const int x0_qn = image_->x0();

    const int32_t x_step_qn =
        av1_get_upscale_convolve_step(width_src, width_dst);

    if (ref) {
      av1_convolve_horiz_rs_c(src, src_stride, dst, dst_stride, width_dst,
                              height, &av1_resize_filter_normative[0][0], x0_qn,
                              x_step_qn);
    } else {
      tst_fun_(src, src_stride, dst, dst_stride, width_dst, height,
               &av1_resize_filter_normative[0][0], x0_qn, x_step_qn);
    }
  }